

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_pq.c
# Opt level: O2

int nghttp2_pq_each(nghttp2_pq *pq,nghttp2_pq_item_cb fun,void *arg)

{
  int iVar1;
  ulong uVar2;
  
  if (pq->length == 0) {
    iVar1 = 0;
  }
  else {
    uVar2 = 0;
    do {
      if (pq->length <= uVar2) {
        return 0;
      }
      iVar1 = (*fun)(pq->q[uVar2],arg);
      uVar2 = uVar2 + 1;
    } while (iVar1 == 0);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int nghttp2_pq_each(nghttp2_pq *pq, nghttp2_pq_item_cb fun, void *arg) {
  size_t i;

  if (pq->length == 0) {
    return 0;
  }
  for (i = 0; i < pq->length; ++i) {
    if ((*fun)(pq->q[i], arg)) {
      return 1;
    }
  }
  return 0;
}